

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

JSON json::anon_unknown_1::parse_next(string *str,size_t *offset)

{
  char *pcVar1;
  runtime_error *this;
  undefined8 uVar2;
  size_t *in_RSI;
  BackingData in_RDI;
  JSON JVar3;
  size_t *in_stack_00000010;
  string *in_stack_00000018;
  size_t *in_stack_00000020;
  string *in_stack_00000028;
  size_t *in_stack_00000040;
  string *in_stack_00000048;
  size_t *in_stack_000000a0;
  string *in_stack_000000a8;
  char value;
  size_t *in_stack_000000f0;
  string *in_stack_000000f8;
  size_t *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_81 [65];
  string local_40 [39];
  char local_19;
  BackingData str_00;
  
  str_00 = in_RDI;
  consume_ws(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_19 = *pcVar1;
  if (local_19 == '\"') {
    JVar3 = parse_string(in_stack_00000028,in_stack_00000020);
    uVar2 = JVar3._8_8_;
  }
  else if (local_19 == '[') {
    JVar3 = parse_array(str_00.String,in_RSI);
    uVar2 = JVar3._8_8_;
  }
  else {
    if (local_19 != 'f') {
      if (local_19 == 'n') {
        JVar3 = parse_null(in_stack_00000018,in_stack_00000010);
        uVar2 = JVar3._8_8_;
        goto LAB_0034b941;
      }
      if (local_19 != 't') {
        if (local_19 == '{') {
          JVar3 = parse_object(in_stack_000000a8,in_stack_000000a0);
          uVar2 = JVar3._8_8_;
        }
        else {
          if ((('9' < local_19) || (local_19 < '0')) && (local_19 != '-')) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_81 + 1),
                       "JSON ERROR: Parse: Unexpected starting character \'",(allocator *)__lhs);
            std::operator+(__lhs,(char)((ulong)this >> 0x38));
            std::operator+(__lhs,(char *)this);
            std::runtime_error::runtime_error(this,local_40);
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          JVar3 = parse_number(in_stack_000000f8,in_stack_000000f0);
          uVar2 = JVar3._8_8_;
        }
        goto LAB_0034b941;
      }
    }
    JVar3 = parse_bool(in_stack_00000048,in_stack_00000040);
    uVar2 = JVar3._8_8_;
  }
LAB_0034b941:
  JVar3._8_8_ = uVar2;
  JVar3.Internal.String = in_RDI.String;
  return JVar3;
}

Assistant:

JSON parse_next( const string &str, size_t &offset ) {
        char value;
        consume_ws( str, offset );
        value = str[offset];
        switch( value ) {
            case '[' : return parse_array( str, offset );
            case '{' : return parse_object( str, offset );
            case '\"': return parse_string( str, offset );
            case 't' :
            case 'f' : return parse_bool( str, offset );
            case 'n' : return parse_null( str, offset );
            default  : if( ( value <= '9' && value >= '0' ) || value == '-' )
                           return parse_number( str, offset );
        }
        throw std::runtime_error(std::string("JSON ERROR: Parse: Unexpected starting character '") + value + "'");
    }